

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::TypedConfigurations::~TypedConfigurations(TypedConfigurations *this)

{
  TypedConfigurations *this_local;
  
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0018e4c8;
  utils::std::
  unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  ::~unordered_map(&this->m_logFlushThresholdMap);
  utils::std::
  unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  ::~unordered_map(&this->m_maxLogFileSizeMap);
  utils::std::
  unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ::~unordered_map(&this->m_fileStreamMap);
  utils::std::
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  ::~unordered_map(&this->m_performanceTrackingMap);
  utils::std::
  unordered_map<el::Level,_el::base::SubsecondPrecision,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
  ::~unordered_map(&this->m_subsecondPrecisionMap);
  utils::std::
  unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  ::~unordered_map(&this->m_logFormatMap);
  utils::std::
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  ::~unordered_map(&this->m_toStandardOutputMap);
  utils::std::
  unordered_map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map(&this->m_filenameMap);
  utils::std::
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  ::~unordered_map(&this->m_toFileMap);
  utils::std::
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  ::~unordered_map(&this->m_enabledMap);
  threading::ThreadSafe::~ThreadSafe(&this->super_ThreadSafe);
  return;
}

Assistant:

virtual ~TypedConfigurations(void) {
  }